

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRConstant * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::
allocate<unsigned_int&,unsigned_int*,unsigned_int,bool>
          (ObjectPool<spirv_cross::SPIRConstant> *this,uint *p,uint **p_1,uint *p_2,bool *p_3)

{
  Vector<spirv_cross::SPIRConstant_*> *this_00;
  SPIRConstant *pSVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  SPIRConstant *ptr;
  SPIRConstant *local_40;
  SPIRConstant *local_38;
  
  this_00 = &this->vacants;
  sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
  if (sVar2 == 0) {
    uVar3 = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRConstant,_spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar1 = (SPIRConstant *)malloc(uVar3 * 0x168);
    if (pSVar1 == (SPIRConstant *)0x0) {
      return (SPIRConstant *)0x0;
    }
    local_38 = pSVar1;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      local_40 = pSVar1;
      SmallVector<spirv_cross::SPIRConstant_*,_0UL>::push_back(this_00,&local_40);
      pSVar1 = pSVar1 + 1;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRConstant,spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRConstant*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRConstant,spirv_cross::ObjectPool<spirv_cross::SPIRConstant>::MallocDeleter>,8ul>
                *)&this->memory,&local_38);
    sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRConstant_*>.buffer_size;
  }
  pSVar1 = (this_00->super_VectorView<spirv_cross::SPIRConstant_*>).ptr[sVar2 - 1];
  SmallVector<spirv_cross::SPIRConstant_*,_0UL>::pop_back(this_00);
  SPIRConstant::SPIRConstant(pSVar1,(TypeID)*p,*p_1,*p_2,*p_3);
  return pSVar1;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}